

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

void llvm::sys::path::append
               (SmallVectorImpl<char> *path,Style style,Twine *a,Twine *b,Twine *c,Twine *d)

{
  bool bVar1;
  char value;
  iterator pSVar2;
  size_t sVar3;
  reference pcVar4;
  char *Str;
  size_type Start;
  iterator pcVar5;
  iterator pcVar6;
  StringRef SVar7;
  bool local_2e7;
  byte local_2e5;
  bool local_2e2;
  bool local_27a;
  char local_209;
  Twine local_208;
  bool local_1e9;
  undefined1 auStack_1e8 [7];
  bool component_has_sep;
  StringRef c_1;
  size_t loc;
  bool path_has_sep;
  StringRef *component;
  iterator __end2;
  iterator __begin2;
  SmallVector<llvm::StringRef,_4U> *__range2;
  size_t local_190;
  StringRef local_188;
  StringRef local_178;
  StringRef local_168;
  undefined1 local_158 [8];
  SmallVector<llvm::StringRef,_4U> components;
  SmallString<32U> d_storage;
  SmallString<32U> c_storage;
  undefined1 local_98 [8];
  SmallString<32U> b_storage;
  SmallString<32U> a_storage;
  Twine *d_local;
  Twine *c_local;
  Twine *b_local;
  Twine *a_local;
  Style style_local;
  SmallVectorImpl<char> *path_local;
  
  SmallString<32U>::SmallString
            ((SmallString<32U> *)
             (b_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts
             + 0x18));
  SmallString<32U>::SmallString((SmallString<32U> *)local_98);
  SmallString<32U>::SmallString
            ((SmallString<32U> *)
             (d_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts
             + 0x18));
  SmallString<32U>::SmallString
            ((SmallString<32U> *)
             (components.super_SmallVectorStorage<llvm::StringRef,_4U>.InlineElts[3].buffer + 8));
  SmallVector<llvm::StringRef,_4U>::SmallVector((SmallVector<llvm::StringRef,_4U> *)local_158);
  bVar1 = Twine::isTriviallyEmpty(a);
  if (!bVar1) {
    local_168 = Twine::toStringRef(a,(SmallVectorImpl<char> *)
                                     (b_storage.super_SmallVector<char,_32U>.
                                      super_SmallVectorStorage<char,_32U>.InlineElts + 0x18));
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              ((SmallVectorTemplateBase<llvm::StringRef,_true> *)local_158,&local_168);
  }
  bVar1 = Twine::isTriviallyEmpty(b);
  if (!bVar1) {
    local_178 = Twine::toStringRef(b,(SmallVectorImpl<char> *)local_98);
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              ((SmallVectorTemplateBase<llvm::StringRef,_true> *)local_158,&local_178);
  }
  bVar1 = Twine::isTriviallyEmpty(c);
  if (!bVar1) {
    local_188 = Twine::toStringRef(c,(SmallVectorImpl<char> *)
                                     (d_storage.super_SmallVector<char,_32U>.
                                      super_SmallVectorStorage<char,_32U>.InlineElts + 0x18));
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              ((SmallVectorTemplateBase<llvm::StringRef,_true> *)local_158,&local_188);
  }
  bVar1 = Twine::isTriviallyEmpty(d);
  if (!bVar1) {
    SVar7 = Twine::toStringRef(d,(SmallVectorImpl<char> *)
                                 (components.super_SmallVectorStorage<llvm::StringRef,_4U>.
                                  InlineElts[3].buffer + 8));
    local_190 = SVar7.Length;
    __range2 = (SmallVector<llvm::StringRef,_4U> *)SVar7.Data;
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              ((SmallVectorTemplateBase<llvm::StringRef,_true> *)local_158,(StringRef *)&__range2);
  }
  __end2 = SmallVectorTemplateCommon<llvm::StringRef,_void>::begin
                     ((SmallVectorTemplateCommon<llvm::StringRef,_void> *)local_158);
  pSVar2 = SmallVectorTemplateCommon<llvm::StringRef,_void>::end
                     ((SmallVectorTemplateCommon<llvm::StringRef,_void> *)local_158);
  for (; __end2 != pSVar2; __end2 = __end2 + 1) {
    bVar1 = SmallVectorBase::empty((SmallVectorBase *)path);
    local_27a = false;
    if (!bVar1) {
      sVar3 = SmallVectorBase::size((SmallVectorBase *)path);
      pcVar4 = SmallVectorTemplateCommon<char,_void>::operator[]
                         ((SmallVectorTemplateCommon<char,_void> *)path,sVar3 - 1);
      local_27a = is_separator(*pcVar4,style);
    }
    if (local_27a == false) {
      bVar1 = StringRef::empty(__end2);
      local_2e2 = false;
      if (!bVar1) {
        value = StringRef::operator[](__end2,0);
        local_2e2 = is_separator(value,style);
      }
      local_1e9 = local_2e2;
      local_2e5 = 0;
      if (local_2e2 == false) {
        bVar1 = SmallVectorBase::empty((SmallVectorBase *)path);
        local_2e7 = true;
        if (!bVar1) {
          Twine::Twine(&local_208,__end2);
          local_2e7 = has_root_name(&local_208,style);
        }
        local_2e5 = local_2e7 ^ 0xff;
      }
      if ((local_2e5 & 1) != 0) {
        local_209 = anon_unknown.dwarf_3697931::preferred_separator(style);
        SmallVectorTemplateBase<char,_true>::push_back
                  (&path->super_SmallVectorTemplateBase<char,_true>,&local_209);
      }
      pcVar5 = StringRef::begin(__end2);
      pcVar6 = StringRef::end(__end2);
      SmallVectorImpl<char>::append<char_const*,void>(path,pcVar5,pcVar6);
    }
    else {
      Str = anon_unknown.dwarf_3697931::separators(style);
      StringRef::StringRef((StringRef *)&c_1.Length,Str);
      Start = StringRef::find_first_not_of(__end2,stack0xfffffffffffffe28,0);
      SVar7 = StringRef::substr(__end2,Start,0xffffffffffffffff);
      c_1.Data = (char *)SVar7.Length;
      _auStack_1e8 = SVar7.Data;
      pcVar5 = StringRef::begin((StringRef *)auStack_1e8);
      pcVar6 = StringRef::end((StringRef *)auStack_1e8);
      SmallVectorImpl<char>::append<char_const*,void>(path,pcVar5,pcVar6);
    }
  }
  SmallVector<llvm::StringRef,_4U>::~SmallVector((SmallVector<llvm::StringRef,_4U> *)local_158);
  SmallString<32U>::~SmallString
            ((SmallString<32U> *)
             (components.super_SmallVectorStorage<llvm::StringRef,_4U>.InlineElts[3].buffer + 8));
  SmallString<32U>::~SmallString
            ((SmallString<32U> *)
             (d_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts
             + 0x18));
  SmallString<32U>::~SmallString((SmallString<32U> *)local_98);
  SmallString<32U>::~SmallString
            ((SmallString<32U> *)
             (b_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts
             + 0x18));
  return;
}

Assistant:

void append(SmallVectorImpl<char> &path, Style style, const Twine &a,
            const Twine &b, const Twine &c, const Twine &d) {
  SmallString<32> a_storage;
  SmallString<32> b_storage;
  SmallString<32> c_storage;
  SmallString<32> d_storage;

  SmallVector<StringRef, 4> components;
  if (!a.isTriviallyEmpty()) components.push_back(a.toStringRef(a_storage));
  if (!b.isTriviallyEmpty()) components.push_back(b.toStringRef(b_storage));
  if (!c.isTriviallyEmpty()) components.push_back(c.toStringRef(c_storage));
  if (!d.isTriviallyEmpty()) components.push_back(d.toStringRef(d_storage));

  for (auto &component : components) {
    bool path_has_sep =
        !path.empty() && is_separator(path[path.size() - 1], style);
    if (path_has_sep) {
      // Strip separators from beginning of component.
      size_t loc = component.find_first_not_of(separators(style));
      StringRef c = component.substr(loc);

      // Append it.
      path.append(c.begin(), c.end());
      continue;
    }

    bool component_has_sep =
        !component.empty() && is_separator(component[0], style);
    if (!component_has_sep &&
        !(path.empty() || has_root_name(component, style))) {
      // Add a separator.
      path.push_back(preferred_separator(style));
    }

    path.append(component.begin(), component.end());
  }
}